

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeevents.cpp
# Opt level: O0

void __thiscall
YAML::NodeEvents::Emit(NodeEvents *this,node *node,EventHandler *handler,AliasManager *am)

{
  bool bVar1;
  value vVar2;
  value vVar3;
  anchor_t aVar4;
  string *psVar5;
  node_iterator_base<const_YAML::detail::node> *this_00;
  string *psVar6;
  EventHandler *in_RCX;
  node *in_RDX;
  NodeEvents *in_RSI;
  value_type element_1;
  const_node_iterator __end2_1;
  const_node_iterator __begin2_1;
  node *__range2_1;
  value_type element;
  const_node_iterator __end2;
  const_node_iterator __begin2;
  node *__range2;
  anchor_t anchor;
  node_iterator_base<const_YAML::detail::node> *in_stack_fffffffffffffe68;
  node *in_stack_fffffffffffffe70;
  node *in_stack_fffffffffffffe80;
  AliasManager *in_stack_fffffffffffffe88;
  node_iterator_base<const_YAML::detail::node> *in_stack_fffffffffffffe90;
  node *in_stack_fffffffffffffe98;
  NodeEvents *in_stack_fffffffffffffea0;
  Mark local_c4;
  node_iterator_value<const_YAML::detail::node> local_b8 [4];
  Mark local_58;
  Mark local_4c;
  Mark local_40;
  Mark local_34;
  AliasManager *this_01;
  AliasManager *pAVar7;
  node *pnVar8;
  
  this_01 = (AliasManager *)0x0;
  bVar1 = IsAliased(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (bVar1) {
    aVar4 = AliasManager::LookupAnchor(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    if (aVar4 != 0) {
      Mark::Mark(&local_34);
      (*(code *)(in_RDX->m_pRef).
                super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
                m_pData.super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)(in_RDX,&local_34,aVar4);
      return;
    }
    AliasManager::RegisterReference
              ((AliasManager *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    this_01 = (AliasManager *)
              AliasManager::LookupAnchor(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  }
  vVar2 = detail::node::type((node *)0xf0e7d7);
  switch(vVar2) {
  case Undefined:
    break;
  case Null:
    Mark::Mark(&local_40);
    (*(code *)(in_RDX->m_pRef).
              super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
              m_pData.super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )(in_RDX,&local_40,this_01);
    break;
  case Scalar:
    Mark::Mark(&local_4c);
    psVar6 = detail::node::tag_abi_cxx11_((node *)0xf0e862);
    psVar5 = detail::node::scalar_abi_cxx11_((node *)0xf0e881);
    (*(code *)(in_RDX->m_pRef).
              super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3].
              m_pData.super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )(in_RDX,&local_4c,psVar6,this_01,psVar5);
    break;
  case Sequence:
    pnVar8 = in_RDX;
    Mark::Mark(&local_58);
    this_00 = (node_iterator_base<const_YAML::detail::node> *)
              detail::node::tag_abi_cxx11_((node *)0xf0e8cd);
    pAVar7 = this_01;
    vVar3 = detail::node::style((node *)0xf0e8ec);
    (*(code *)(in_RDX->m_pRef).
              super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3].
              m_pData.super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)(in_RDX,&local_58,this_00,this_01,vVar3);
    detail::node::begin(in_stack_fffffffffffffe70);
    detail::node::end(in_stack_fffffffffffffe70);
    while (bVar1 = detail::node_iterator_base<YAML::detail::node_const>::operator!=
                             ((node_iterator_base<const_YAML::detail::node> *)
                              in_stack_fffffffffffffe70,in_stack_fffffffffffffe68), bVar1) {
      detail::node_iterator_base<const_YAML::detail::node>::operator*(this_00);
      detail::node_iterator_value<const_YAML::detail::node>::operator*(local_b8);
      Emit(in_RSI,pnVar8,in_RCX,pAVar7);
      detail::node_iterator_base<const_YAML::detail::node>::operator++
                ((node_iterator_base<const_YAML::detail::node> *)in_stack_fffffffffffffe80);
    }
    (*(code *)(pnVar8->m_pRef).
              super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
              m_pData.super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )();
    break;
  case Map:
    pnVar8 = in_RDX;
    Mark::Mark(&local_c4);
    psVar6 = detail::node::tag_abi_cxx11_((node *)0xf0e9e9);
    pAVar7 = this_01;
    vVar3 = detail::node::style((node *)0xf0ea08);
    (*(code *)(in_RDX->m_pRef).
              super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
              m_pData.super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)(in_RDX,&local_c4,psVar6,this_01,vVar3);
    detail::node::begin(in_RDX);
    detail::node::end(in_RDX);
    while (bVar1 = detail::node_iterator_base<YAML::detail::node_const>::operator!=
                             ((node_iterator_base<const_YAML::detail::node> *)in_RDX,
                              in_stack_fffffffffffffe68), bVar1) {
      detail::node_iterator_base<const_YAML::detail::node>::operator*(in_stack_fffffffffffffe90);
      Emit(in_RSI,pnVar8,in_RCX,pAVar7);
      Emit(in_RSI,pnVar8,in_RCX,pAVar7);
      detail::node_iterator_base<const_YAML::detail::node>::operator++
                ((node_iterator_base<const_YAML::detail::node> *)this_01);
    }
    (*(code *)(pnVar8->m_pRef).
              super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
              m_pData.super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )();
  }
  return;
}

Assistant:

void NodeEvents::Emit(const detail::node& node, EventHandler& handler,
                      AliasManager& am) const {
  anchor_t anchor = NullAnchor;
  if (IsAliased(node)) {
    anchor = am.LookupAnchor(node);
    if (anchor) {
      handler.OnAlias(Mark(), anchor);
      return;
    }

    am.RegisterReference(node);
    anchor = am.LookupAnchor(node);
  }

  switch (node.type()) {
    case NodeType::Undefined:
      break;
    case NodeType::Null:
      handler.OnNull(Mark(), anchor);
      break;
    case NodeType::Scalar:
      handler.OnScalar(Mark(), node.tag(), anchor, node.scalar());
      break;
    case NodeType::Sequence:
      handler.OnSequenceStart(Mark(), node.tag(), anchor, node.style());
      for (auto element : node)
        Emit(*element, handler, am);
      handler.OnSequenceEnd();
      break;
    case NodeType::Map:
      handler.OnMapStart(Mark(), node.tag(), anchor, node.style());
      for (auto element : node) {
        Emit(*element.first, handler, am);
        Emit(*element.second, handler, am);
      }
      handler.OnMapEnd();
      break;
  }
}